

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O3

uint32 ParticleColor(int rgb)

{
  byte bVar1;
  Node *pNVar2;
  Node *pNVar3;
  uint uVar4;
  
  pNVar3 = ColorSaver.Nodes + (ColorSaver.Size - 1 & rgb);
  while ((pNVar2 = pNVar3, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar3 = pNVar2->Next;
    if ((pNVar2->Pair).Key == rgb) {
      return (pNVar2->Pair).Value;
    }
  }
  bVar1 = FColorMatcher::Pick(&ColorMatcher,(uint)rgb >> 0x10 & 0xff,(uint)rgb >> 8 & 0xff,
                              rgb & 0xff);
  uVar4 = (uint)bVar1 << 0x18 | rgb;
  pNVar3 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::GetNode(&ColorSaver,rgb);
  (pNVar3->Pair).Value = uVar4;
  return uVar4;
}

Assistant:

static uint32 ParticleColor(int rgb)
{
	int *val;
	int stuff;

	val = ColorSaver.CheckKey(rgb);
	if (val != NULL)
	{
		return *val;
	}
	stuff = rgb | (ColorMatcher.Pick(RPART(rgb), GPART(rgb), BPART(rgb)) << 24);
	ColorSaver[rgb] = stuff;
	return stuff;
}